

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O1

bool __thiscall QPDF::allowExtractAll(QPDF *this)

{
  bool bVar1;
  int P;
  int R;
  encryption_method_e file;
  encryption_method_e string;
  encryption_method_e stream;
  int V;
  uint local_20 [2];
  encryption_method_e local_18;
  encryption_method_e local_14;
  encryption_method_e local_10;
  int local_c;
  
  local_20[1] = 0;
  local_20[0] = 0;
  bVar1 = isEncrypted(this,(int *)(local_20 + 1),(int *)local_20,&local_c,&local_10,&local_14,
                      &local_18);
  return (bool)(!bVar1 | (byte)((local_20[0] & 0x10) >> 4));
}

Assistant:

bool
QPDF::allowExtractAll()
{
    int R = 0;
    int P = 0;
    bool status = true;
    if (isEncrypted(R, P)) {
        status = is_bit_set(P, 5);
    }
    return status;
}